

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadImage(ColladaParser *this,Image *pImage)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Logger *pLVar5;
  byte *pbVar6;
  byte *pbVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  byte bVar12;
  char *pcVar13;
  
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar3 != '\0') {
    do {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar3 != 1) {
        if (iVar4 == 2) {
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"image");
          if (iVar3 == 0) {
            return;
          }
        }
        goto LAB_003c81d0;
      }
      if (iVar4 != 1) {
LAB_003c84ec:
        __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaParser.h"
                      ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"image");
      if (iVar3 == 0) {
LAB_003c81a4:
        SkipElement(this);
      }
      else {
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) goto LAB_003c84ec;
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"init_from");
        if (iVar3 == 0) {
          if (this->mFormat == FV_1_5_n) {
            uVar11 = TestAttribute(this,"array_index");
            if ((uVar11 == 0xffffffff) ||
               (iVar3 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar11),
               iVar3 < 1)) {
              uVar11 = TestAttribute(this,"mip_index");
              if ((uVar11 == 0xffffffff) ||
                 (iVar3 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar11),
                 iVar3 < 1)) goto LAB_003c81d0;
              pLVar5 = DefaultLogger::get();
              pcVar13 = "Collada: Ignoring MIP map layer";
            }
            else {
              pLVar5 = DefaultLogger::get();
              pcVar13 = "Collada: Ignoring texture array index";
            }
            Logger::warn(pLVar5,pcVar13);
          }
          else if (this->mFormat == FV_1_4_n) {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
            if ((char)iVar3 == '\0') {
              pcVar13 = TestTextContent(this);
              if (pcVar13 != (char *)0x0) {
                pcVar2 = (char *)(pImage->mFileName)._M_string_length;
                strlen(pcVar13);
                std::__cxx11::string::_M_replace((ulong)pImage,0,pcVar2,(ulong)pcVar13);
              }
              TestClosing(this,"init_from");
            }
            if ((pImage->mFileName)._M_string_length == 0) {
              std::__cxx11::string::_M_replace((ulong)pImage,0,(char *)0x0,0x6b9bff);
            }
          }
        }
        else {
          if (this->mFormat != FV_1_5_n) goto LAB_003c81a4;
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 != 1) goto LAB_003c84ec;
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar3 = strcmp((char *)CONCAT44(extraout_var_02,iVar3),"ref");
          if (iVar3 == 0) {
            pcVar13 = TestTextContent(this);
            if (pcVar13 != (char *)0x0) {
              pcVar2 = (char *)(pImage->mFileName)._M_string_length;
              strlen(pcVar13);
              std::__cxx11::string::_M_replace((ulong)pImage,0,pcVar2,(ulong)pcVar13);
            }
            pcVar13 = "ref";
          }
          else {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar3 != 1) goto LAB_003c84ec;
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar3 = strcmp((char *)CONCAT44(extraout_var_03,iVar3),"hex");
            if ((iVar3 != 0) || ((pImage->mFileName)._M_string_length != 0)) goto LAB_003c81d0;
            iVar3 = TestAttribute(this,"format");
            if (iVar3 == -1) {
              pLVar5 = DefaultLogger::get();
              Logger::warn(pLVar5,"Collada: Unknown image file format");
            }
            else {
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])();
              pcVar13 = (char *)(pImage->mEmbeddedFormat)._M_string_length;
              strlen((char *)CONCAT44(extraout_var_04,iVar3));
              std::__cxx11::string::_M_replace
                        ((ulong)&pImage->mEmbeddedFormat,0,pcVar13,CONCAT44(extraout_var_04,iVar3));
            }
            pbVar6 = (byte *)GetTextContent(this);
            uVar11 = 0;
            pbVar7 = pbVar6;
            while ((0x20 < (ulong)*pbVar7 || ((0x100003601U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0)))
            {
              pbVar7 = pbVar7 + 1;
              uVar11 = uVar11 + 2;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&pImage->mImageData,(ulong)uVar11);
            if (uVar11 != 0) {
              uVar8 = 0;
              do {
                uVar10 = (ulong)(uint)((int)uVar8 * 2);
                bVar9 = pbVar6[uVar10];
                bVar12 = bVar9 - 0x30;
                if (9 < bVar12) {
                  if ((byte)(bVar9 + 0x9f) < 6) {
                    bVar12 = bVar9 + 0xa9;
                  }
                  else {
                    bVar12 = bVar9 - 0x37;
                    if (5 < (byte)(bVar9 + 0xbf)) {
                      bVar12 = 0xff;
                    }
                  }
                }
                bVar1 = pbVar6[uVar10 + 1];
                bVar9 = bVar1 - 0x30;
                if (9 < bVar9) {
                  if ((byte)(bVar1 + 0x9f) < 6) {
                    bVar9 = bVar1 + 0xa9;
                  }
                  else {
                    bVar9 = bVar1 - 0x37;
                    if (5 < (byte)(bVar1 + 0xbf)) {
                      bVar9 = 0xff;
                    }
                  }
                }
                (pImage->mImageData).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8] = bVar12 * '\x10' + bVar9;
                uVar8 = uVar8 + 1;
              } while (uVar8 != uVar11);
            }
            pcVar13 = "hex";
          }
          TestClosing(this,pcVar13);
        }
      }
LAB_003c81d0:
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar3 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadImage(Collada::Image& pImage)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            // Need to run different code paths here, depending on the Collada XSD version
            if (IsElement("image")) {
                SkipElement();
            }
            else if (IsElement("init_from"))
            {
                if (mFormat == FV_1_4_n)
                {
                    // FIX: C4D exporter writes empty <init_from/> tags
                    if (!mReader->isEmptyElement()) {
                        // element content is filename - hopefully
                        const char* sz = TestTextContent();
                        if (sz)pImage.mFileName = sz;
                        TestClosing("init_from");
                    }
                    if (!pImage.mFileName.length()) {
                        pImage.mFileName = "unknown_texture";
                    }
                }
                else if (mFormat == FV_1_5_n)
                {
                    // make sure we skip over mip and array initializations, which
                    // we don't support, but which could confuse the loader if
                    // they're not skipped.
                    int attrib = TestAttribute("array_index");
                    if (attrib != -1 && mReader->getAttributeValueAsInt(attrib) > 0) {
                        ASSIMP_LOG_WARN("Collada: Ignoring texture array index");
                        continue;
                    }

                    attrib = TestAttribute("mip_index");
                    if (attrib != -1 && mReader->getAttributeValueAsInt(attrib) > 0) {
                        ASSIMP_LOG_WARN("Collada: Ignoring MIP map layer");
                        continue;
                    }

                    // TODO: correctly jump over cube and volume maps?
                }
            }
            else if (mFormat == FV_1_5_n)
            {
                if (IsElement("ref"))
                {
                    // element content is filename - hopefully
                    const char* sz = TestTextContent();
                    if (sz)pImage.mFileName = sz;
                    TestClosing("ref");
                }
                else if (IsElement("hex") && !pImage.mFileName.length())
                {
                    // embedded image. get format
                    const int attrib = TestAttribute("format");
                    if (-1 == attrib)
                        ASSIMP_LOG_WARN("Collada: Unknown image file format");
                    else pImage.mEmbeddedFormat = mReader->getAttributeValue(attrib);

                    const char* data = GetTextContent();

                    // hexadecimal-encoded binary octets. First of all, find the
                    // required buffer size to reserve enough storage.
                    const char* cur = data;
                    while (!IsSpaceOrNewLine(*cur)) cur++;

                    const unsigned int size = (unsigned int)(cur - data) * 2;
                    pImage.mImageData.resize(size);
                    for (unsigned int i = 0; i < size; ++i)
                        pImage.mImageData[i] = HexOctetToDecimal(data + (i << 1));

                    TestClosing("hex");
                }
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "image") == 0)
                break;
        }
    }
}